

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::
GetResourceByName<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
          (ShaderVariableManagerGL *this,Char *Name)

{
  Uint32 UVar1;
  int iVar2;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_00;
  PipelineResourceDesc *pPVar3;
  PipelineResourceDesc *ResDesc;
  StorageBufferBindInfo *Resource;
  Uint32 res;
  Uint32 NumResources;
  Char *Name_local;
  ShaderVariableManagerGL *this_local;
  
  UVar1 = GetNumResources<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this);
  Resource._0_4_ = 0;
  while( true ) {
    if (UVar1 <= (uint)Resource) {
      return (IShaderResourceVariable *)0x0;
    }
    this_00 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
               *)GetResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                           (this,(uint)Resource);
    pPVar3 = ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             ::GetDesc(this_00);
    iVar2 = strcmp(pPVar3->Name,Name);
    if (iVar2 == 0) break;
    Resource._0_4_ = (uint)Resource + 1;
  }
  return &this_00->super_IShaderResourceVariable;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetResourceByName(const Char* Name) const
{
    auto NumResources = GetNumResources<ResourceType>();
    for (Uint32 res = 0; res < NumResources; ++res)
    {
        auto&       Resource = GetResource<ResourceType>(res);
        const auto& ResDesc  = Resource.GetDesc();
        if (strcmp(ResDesc.Name, Name) == 0)
            return &Resource;
    }

    return nullptr;
}